

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

void __thiscall args::PositionalBase::Validate(PositionalBase *this,string *param_1,string *param_2)

{
  int iVar1;
  ostream *poVar2;
  RequiredError *this_00;
  string local_1b0;
  ostringstream problem;
  
  if (((this->super_NamedBase).super_Base.options & Required) != None) {
    iVar1 = (*(this->super_NamedBase).super_Base._vptr_Base[2])();
    if ((char)iVar1 == '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&problem);
      poVar2 = std::operator<<((ostream *)&problem,"Option \'");
      (*(this->super_NamedBase).super_Base._vptr_Base[0x12])(&local_1b0,this);
      poVar2 = std::operator<<(poVar2,(string *)&local_1b0);
      std::operator<<(poVar2,"\' is required");
      std::__cxx11::string::~string((string *)&local_1b0);
      this_00 = (RequiredError *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      RequiredError::RequiredError(this_00,&local_1b0);
      __cxa_throw(this_00,&RequiredError::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

bool IsRequired() const noexcept
            {
                return (GetOptions() & Options::Required) != Options::None;
            }